

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall AddrManImpl::Check(AddrManImpl *this)

{
  long lVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  long in_FS_OFFSET;
  LogFlags unaff_retaddr;
  int in_stack_0000000c;
  ConstevalFormatString<1U> in_stack_00000048;
  undefined1 in_stack_00000050 [16];
  int err;
  undefined1 in_stack_00000060 [16];
  AddrManImpl *in_stack_00000100;
  Level in_stack_00000140;
  int *in_stack_00000150;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             (AnnotatedMixin<std::mutex> *)0x8825bd);
  if (((*(int *)&in_RDI[0xa01b]._M_str != 0) &&
      (iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                         (in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20)), iVar2 < 1)) &&
     (iVar2 = CheckAddrman(in_stack_00000100), iVar2 != 0)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_ffffffffffffffb0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_ffffffffffffffb0);
    LogPrintFormatInternal<int>
              ((string_view)in_stack_00000060,(string_view)in_stack_00000050,in_stack_0000000c,
               unaff_retaddr,in_stack_00000140,in_stack_00000048,in_stack_00000150);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                  ,0x420,"void AddrManImpl::Check() const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddrManImpl::Check() const
{
    AssertLockHeld(cs);

    // Run consistency checks 1 in m_consistency_check_ratio times if enabled
    if (m_consistency_check_ratio == 0) return;
    if (insecure_rand.randrange(m_consistency_check_ratio) >= 1) return;

    const int err{CheckAddrman()};
    if (err) {
        LogPrintf("ADDRMAN CONSISTENCY CHECK FAILED!!! err=%i\n", err);
        assert(false);
    }
}